

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.cpp
# Opt level: O1

void __thiscall llvm::printHTMLEscaped(llvm *this,StringRef String,raw_ostream *Out)

{
  llvm lVar1;
  llvm *__n;
  raw_ostream *this_00;
  size_t sVar2;
  raw_ostream *extraout_RDX;
  raw_ostream *__buf;
  raw_ostream *extraout_RDX_00;
  char *pcVar3;
  uint __fd;
  char *pcVar4;
  iterator __begin1;
  StringRef Str;
  
  this_00 = (raw_ostream *)String.Length;
  if (String.Data != (char *)0x0) {
    pcVar3 = (char *)0x0;
    __buf = this_00;
    do {
      lVar1 = this[(long)pcVar3];
      __fd = (uint)(byte)lVar1;
      if ((byte)lVar1 < 0x27) {
        if (lVar1 == (llvm)0x22) {
          sVar2 = 6;
          pcVar4 = "&quot;";
          goto LAB_0012deaa;
        }
        if (lVar1 == (llvm)0x26) {
          sVar2 = 5;
          pcVar4 = "&amp;";
          goto LAB_0012deaa;
        }
LAB_0012deb9:
        __n = (llvm *)this_00->OutBufCur;
        if (__n < (llvm *)this_00->OutBufEnd) {
          __buf = (raw_ostream *)(__n + 1);
          this_00->OutBufCur = (char *)__buf;
          *__n = lVar1;
        }
        else {
          raw_ostream::write(this_00,__fd,__buf,(size_t)__n);
          __buf = extraout_RDX_00;
        }
      }
      else {
        if (lVar1 == (llvm)0x27) {
          sVar2 = 6;
          pcVar4 = "&apos;";
        }
        else if (__fd == 0x3c) {
          sVar2 = 4;
          pcVar4 = "&lt;";
        }
        else {
          if (__fd != 0x3e) goto LAB_0012deb9;
          sVar2 = 4;
          pcVar4 = "&gt;";
        }
LAB_0012deaa:
        Str.Length = sVar2;
        Str.Data = pcVar4;
        raw_ostream::operator<<(this_00,Str);
        __buf = extraout_RDX;
      }
      pcVar3 = pcVar3 + 1;
    } while (String.Data != pcVar3);
  }
  return;
}

Assistant:

void llvm::printHTMLEscaped(StringRef String, raw_ostream &Out) {
  for (char C : String) {
    if (C == '&')
      Out << "&amp;";
    else if (C == '<')
      Out << "&lt;";
    else if (C == '>')
      Out << "&gt;";
    else if (C == '\"')
      Out << "&quot;";
    else if (C == '\'')
      Out << "&apos;";
    else
      Out << C;
  }
}